

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_isotropic(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *hh)

{
  REF_NODE ref_node;
  uint uVar1;
  int iVar2;
  REF_DBL *metric_00;
  double *pdVar3;
  undefined8 uVar4;
  REF_DBL *pRVar5;
  char *pcVar6;
  REF_DBL *m;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  REF_DBL d_imply [12];
  REF_DBL d_met [12];
  double local_f8;
  double local_f0;
  REF_DBL local_98;
  double local_90 [12];
  
  ref_node = ref_grid->node;
  if (ref_node->max < 0) {
    pcVar6 = "malloc metric_imply of REF_DBL negative";
    uVar4 = 0xda1;
LAB_001efe9d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar4,
           "ref_metric_isotropic",pcVar6);
    uVar1 = 1;
  }
  else {
    metric_00 = (REF_DBL *)malloc((ulong)(uint)ref_node->max * 0x30);
    if (metric_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xda1,"ref_metric_isotropic","malloc metric_imply of REF_DBL NULL");
      uVar1 = 2;
    }
    else {
      uVar1 = ref_metric_imply_from(metric_00,ref_grid);
      if (uVar1 == 0) {
        iVar2 = ref_node->max;
        if (0 < iVar2) {
          pRVar5 = hh + 1;
          lVar7 = 0;
          m = metric_00;
          do {
            if (-1 < ref_node->global[lVar7]) {
              uVar1 = ref_matrix_diag_m(m,&local_f8);
              if (uVar1 != 0) {
                pcVar6 = "eigen decomp";
                uVar4 = 0xda8;
                goto LAB_001efe70;
              }
              dVar10 = local_f8;
              if (local_f8 <= local_f0) {
                dVar10 = local_f0;
              }
              if (dVar10 < 0.0) {
                pcVar6 = "neg eig";
                uVar4 = 0xdab;
                goto LAB_001efe9d;
              }
              dVar9 = SQRT(dVar10);
              dVar8 = dVar9;
              if (dVar10 < 0.0) {
                dVar8 = sqrt(dVar10);
              }
              if (dVar10 < 0.0) {
                dVar9 = sqrt(dVar10);
              }
              if (dVar9 * *(double *)(&DAT_00225350 + (ulong)(0.0 < dVar8 * 1e+20) * 8) <= 1.0) {
                pcVar6 = "div zero";
                uVar4 = 0xdac;
                goto LAB_001efe9d;
              }
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              dVar9 = local_f8;
              if (local_f0 <= local_f8) {
                dVar9 = local_f0;
              }
              if (dVar9 < 0.0) {
                pcVar6 = "neg eig";
                uVar4 = 0xdb1;
                goto LAB_001efe9d;
              }
              dVar8 = SQRT(dVar9);
              dVar11 = dVar8;
              if (dVar9 < 0.0) {
                dVar11 = sqrt(dVar9);
              }
              if (dVar9 < 0.0) {
                dVar8 = sqrt(dVar9);
              }
              if (dVar8 * *(double *)(&DAT_00225350 + (ulong)(0.0 < dVar11 * 1e+20) * 8) <= 1.0) {
                pcVar6 = "div zero";
                uVar4 = 0xdb2;
                goto LAB_001efe9d;
              }
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              dVar10 = 1.0 / dVar10;
              auVar12._0_8_ = (1.0 / dVar9) * 1e+20;
              auVar12._8_8_ = dVar10;
              auVar13._8_8_ = -dVar10;
              auVar13._0_8_ = -auVar12._0_8_;
              auVar13 = maxpd(auVar12,auVar13);
              if (auVar13._0_8_ <= auVar13._8_8_) {
                pcVar6 = "div zero";
                uVar4 = 0xdb5;
                goto LAB_001efe9d;
              }
              uVar1 = ref_matrix_diag_m(metric,&local_98);
              if (uVar1 != 0) {
                pcVar6 = "eigen decomp";
                uVar4 = 0xdb8;
                goto LAB_001efe70;
              }
              uVar1 = ref_matrix_descending_eig(&local_98);
              if (uVar1 != 0) {
                pcVar6 = "really descend?";
                uVar4 = 0xdb9;
                goto LAB_001efe70;
              }
              pdVar3 = local_90;
              if (0.5 <= dVar10 / (1.0 / dVar9)) {
                pdVar3 = &local_98;
              }
              dVar10 = *pdVar3;
              if (dVar10 < 0.0) {
                pcVar6 = "neg eig";
                uVar4 = 0xdbf;
                goto LAB_001efe9d;
              }
              dVar9 = SQRT(dVar10);
              dVar8 = dVar9;
              if (dVar10 < 0.0) {
                dVar8 = sqrt(dVar10);
              }
              if (dVar10 < 0.0) {
                dVar9 = sqrt(dVar10);
              }
              if (dVar9 * *(double *)(&DAT_00225350 + (ulong)(0.0 < dVar8 * 1e+20) * 8) <= 1.0) {
                pcVar6 = "div zero";
                uVar4 = 0xdc0;
                goto LAB_001efe9d;
              }
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              pRVar5[-1] = 1.0 / dVar10;
              *pRVar5 = 0.5;
              iVar2 = ref_node->max;
            }
            lVar7 = lVar7 + 1;
            metric = metric + 6;
            m = m + 6;
            pRVar5 = pRVar5 + 2;
          } while (lVar7 < iVar2);
        }
        uVar1 = ref_node_ghost_dbl(ref_node,hh,2);
        if (uVar1 == 0) {
          free(metric_00);
          return 0;
        }
        pcVar6 = "update ghosts";
        uVar4 = 0xdc7;
      }
      else {
        pcVar6 = "imply";
        uVar4 = 0xda2;
      }
LAB_001efe70:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar4,"ref_metric_isotropic",(ulong)uVar1,pcVar6);
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_isotropic(REF_DBL *metric, REF_GRID ref_grid,
                                        REF_DBL *hh) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_DBL *metric_imply;
  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  RSS(ref_metric_imply_from(metric_imply, ref_grid), "imply");

  each_ref_node_valid_node(ref_node, node) {
    REF_DBL e, d_imply[12], hmin, hmax, d_met[12], h;
    REF_DBL ar;

    RSS(ref_matrix_diag_m(&(metric_imply[6 * node]), d_imply), "eigen decomp");
    e = MAX(MAX(ref_matrix_eig(d_imply, 0), ref_matrix_eig(d_imply, 1)),
            ref_matrix_eig(d_imply, 1));
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    hmin = 1.0 / sqrt(e);

    e = MIN(MIN(ref_matrix_eig(d_imply, 0), ref_matrix_eig(d_imply, 1)),
            ref_matrix_eig(d_imply, 1));
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    hmax = 1.0 / sqrt(e);

    RAS(ref_math_divisible(hmin, hmax), "div zero");
    ar = hmin / hmax;

    RSS(ref_matrix_diag_m(&(metric[6 * node]), d_met), "eigen decomp");
    RSS(ref_matrix_descending_eig(d_met), "really descend?");
    if (ar < 0.5) {
      e = ref_matrix_eig(d_met, 1);
    } else {
      e = ref_matrix_eig(d_met, 0);
    }
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    h = 1.0 / sqrt(e);

    hh[0 + 2 * node] = h;
    hh[1 + 2 * node] = 0.5; /* CADENCE/Pointwise typical decay rate */
  }

  RSS(ref_node_ghost_dbl(ref_node, hh, 2), "update ghosts");

  ref_free(metric_imply);

  return REF_SUCCESS;
}